

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

WriteToEndpoint *
soul::HEARTGenerator::getTopLevelWriteToEndpoint
          (WriteToEndpoint *ws,
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *values)

{
  WriteToEndpoint *ws_00;
  pool_ptr<soul::AST::WriteToEndpoint> chainedWrite;
  pool_ptr<soul::AST::WriteToEndpoint> local_28;
  pool_ref<soul::AST::Expression> local_20;
  
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::insert
            (values,values->items,&ws->value);
  local_20.object = (ws->target).object;
  cast<soul::AST::WriteToEndpoint,soul::AST::Expression>((soul *)&local_28,&local_20);
  if (local_28.object != (WriteToEndpoint *)0x0) {
    ws_00 = pool_ptr<soul::AST::WriteToEndpoint>::operator*(&local_28);
    ws = getTopLevelWriteToEndpoint(ws_00,values);
  }
  return ws;
}

Assistant:

static AST::WriteToEndpoint& getTopLevelWriteToEndpoint (AST::WriteToEndpoint& ws, ArrayWithPreallocation<pool_ref<AST::Expression>, 4>& values)
    {
        values.insert (values.begin(), ws.value);

        if (auto chainedWrite = cast<AST::WriteToEndpoint> (ws.target))
            return getTopLevelWriteToEndpoint (*chainedWrite, values);

        return ws;
    }